

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O0

BlockInfo * __thiscall
Wasm::WasmBytecodeGenerator::GetBlockInfo(WasmBytecodeGenerator *this,uint32 relativeDepth)

{
  uint uVar1;
  WasmCompilationException *this_00;
  BlockInfo **ppBVar2;
  uint32 relativeDepth_local;
  WasmBytecodeGenerator *this_local;
  
  uVar1 = JsUtil::Stack<Wasm::BlockInfo_*,_Memory::ArenaAllocator,_false,_DefaultComparer>::Count
                    (&this->m_blockInfos);
  if (uVar1 <= relativeDepth) {
    this_00 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException(this_00,L"Invalid branch target");
    __cxa_throw(this_00,&WasmCompilationException::typeinfo,
                WasmCompilationException::~WasmCompilationException);
  }
  ppBVar2 = JsUtil::Stack<Wasm::BlockInfo_*,_Memory::ArenaAllocator,_false,_DefaultComparer>::Peek
                      (&this->m_blockInfos,relativeDepth);
  return *ppBVar2;
}

Assistant:

BlockInfo* WasmBytecodeGenerator::GetBlockInfo(uint32 relativeDepth) const
{
    if (relativeDepth >= (uint32)m_blockInfos.Count())
    {
        throw WasmCompilationException(_u("Invalid branch target"));
    }
    return m_blockInfos.Peek(relativeDepth);
}